

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_Choice.H
# Opt level: O2

void Fl_Input_Choice::inp_cb(Fl_Widget *param_1,void *data)

{
  byte bVar1;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_10;
  
  Fl_Widget_Tracker::Fl_Widget_Tracker(&local_10,(Fl_Widget *)data);
  if ((*(byte *)(*(long *)((long)data + 0xa0) + 0x60) & 0x80) == 0) {
    *(uint *)((long)data + 0x60) = *(uint *)((long)data + 0x60) & 0xffffff7f;
    bVar1 = *(byte *)((long)data + 0x6f) & 2;
  }
  else {
    *(uint *)((long)data + 0x60) = *(uint *)((long)data + 0x60) | 0x80;
    bVar1 = *(byte *)((long)data + 0x6f) & 5;
  }
  if (bVar1 != 0) {
    Fl_Widget::do_callback((Fl_Widget *)data);
  }
  if ((local_10.wp_ != (Fl_Widget *)0x0) &&
     (*(code **)((long)data + 0x10) != Fl_Widget::default_callback)) {
    *(byte *)((long)data + 0x60) = *(byte *)((long)data + 0x60) & 0x7f;
  }
  Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_10);
  return;
}

Assistant:

static void inp_cb(Fl_Widget*, void *data) { 
    Fl_Input_Choice *o=(Fl_Input_Choice *)data;
    Fl_Widget_Tracker wp(o);
    if (o->inp_->changed()) {
      o->Fl_Widget::set_changed();
      if (o->when() & (FL_WHEN_CHANGED|FL_WHEN_RELEASE))
	o->do_callback();
    } else {
      o->Fl_Widget::clear_changed();
      if (o->when() & FL_WHEN_NOT_CHANGED)
	o->do_callback();
    }
    
    if (wp.deleted()) return;

    if (o->callback() != default_callback)
      o->Fl_Widget::clear_changed();
  }